

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-spell.c
# Opt level: O1

_Bool spell_cast(wchar_t spell_index,wchar_t dir,command *cmd)

{
  uint32_t *puVar1;
  byte bVar2;
  short sVar3;
  wchar_t wVar4;
  effect *effect;
  player *ppVar5;
  wchar_t *pwVar6;
  _Bool _Var7;
  int16_t iVar8;
  uint32_t uVar9;
  wchar_t *pwVar10;
  int iVar11;
  wchar_t wVar12;
  class_spell *pcVar13;
  undefined4 in_register_00000034;
  source origin;
  source sVar14;
  _Bool ident;
  undefined8 local_38;
  
  local_38 = CONCAT44(in_register_00000034,dir);
  ident = false;
  sVar3 = player->lev;
  _Var7 = flag_has_dbg((player->state).pflags,3,5,"player->state.pflags","(PF_BEAM)");
  wVar4 = (int)sVar3 / 2;
  if (_Var7) {
    wVar4 = (int)sVar3;
  }
  if (spell_index < L'\0') {
    pcVar13 = (class_spell *)0x0;
  }
  else {
    pcVar13 = (class_spell *)0x0;
    if (spell_index < (player->class->magic).total_spells) {
      pwVar6 = &((player->class->magic).books)->num_spells;
      do {
        pwVar10 = pwVar6;
        iVar11 = (int)pcVar13;
        wVar12 = *pwVar10 + iVar11;
        pcVar13 = (class_spell *)(ulong)(uint)wVar12;
        pwVar6 = pwVar10 + 8;
      } while (wVar12 <= spell_index);
      pcVar13 = *(class_spell **)(pwVar10 + 3) + (spell_index - iVar11);
    }
  }
  iVar8 = spell_chance(spell_index);
  uVar9 = Rand_div(100);
  if ((int)uVar9 < (int)iVar8) {
    event_signal(EVENT_INPUT_FLUSH);
    msg("You failed to concentrate hard enough!");
  }
  else {
    effect = pcVar13->effect;
    sVar14 = source_player();
    origin.which = sVar14.which;
    origin._4_4_ = 0;
    origin.what = sVar14.what;
    _Var7 = effect_do(effect,origin,(object *)0x0,&ident,true,(wchar_t)local_38,wVar4,L'\0',cmd);
    if (!_Var7) {
      return false;
    }
    _Var7 = flag_has_dbg((player->state).pflags,3,0x11,"player->state.pflags","(PF_COMBAT_REGEN)");
    if (_Var7) {
      convert_mana_to_hp(player,pcVar13->smana << 0x10);
    }
    sound(0x92);
    bVar2 = player->spell_flags[spell_index];
    if ((bVar2 & 2) == 0) {
      wVar4 = pcVar13->sexp;
      player->spell_flags[spell_index] = bVar2 | 2;
      player_exp_gain(player,wVar4 * pcVar13->slevel);
      puVar1 = &player->upkeep->redraw;
      *puVar1 = *puVar1 | 0x200000;
    }
  }
  ppVar5 = player;
  wVar4 = pcVar13->smana;
  sVar3 = player->csp;
  iVar11 = wVar4 - sVar3;
  if (iVar11 == 0 || wVar4 < sVar3) {
    player->csp = sVar3 - (short)wVar4;
  }
  else {
    ppVar5->csp = 0;
    ppVar5->csp_frac = 0;
    player_over_exert(ppVar5,L'\x02',L'd',iVar11 * 5 + L'\x01');
    player_over_exert(player,L'\x01',L'2',L'\0');
  }
  puVar1 = &player->upkeep->redraw;
  *puVar1 = *puVar1 | 0x80;
  return true;
}

Assistant:

bool spell_cast(int spell_index, int dir, struct command *cmd)
{
	int chance;
	bool ident = false;
	int beam  = beam_chance();

	/* Get the spell */
	const struct class_spell *spell = spell_by_index(player, spell_index);

	/* Spell failure chance */
	chance = spell_chance(spell_index);

	/* Fail or succeed */
	if (randint0(100) < chance) {
		event_signal(EVENT_INPUT_FLUSH);
		msg("You failed to concentrate hard enough!");
	} else {
		/* Cast the spell */
		if (!effect_do(spell->effect, source_player(), NULL, &ident, true, dir,
					   beam, 0, cmd)) {
			return false;
		}

		/* Reward COMBAT_REGEN with small HP recovery */
		if (player_has(player, PF_COMBAT_REGEN)) {
			convert_mana_to_hp(player, spell->smana << 16);
		}

		/* A spell was cast */
		sound(MSG_SPELL);

		if (!(player->spell_flags[spell_index] & PY_SPELL_WORKED)) {
			int e = spell->sexp;

			/* The spell worked */
			player->spell_flags[spell_index] |= PY_SPELL_WORKED;

			/* Gain experience */
			player_exp_gain(player, e * spell->slevel);

			/* Redraw object recall */
			player->upkeep->redraw |= (PR_OBJECT);
		}
	}

	/* Sufficient mana? */
	if (spell->smana <= player->csp) {
		/* Use some mana */
		player->csp -= spell->smana;
	} else {
		int oops = spell->smana - player->csp;

		/* No mana left */
		player->csp = 0;
		player->csp_frac = 0;

		/* Over-exert the player */
		player_over_exert(player, PY_EXERT_FAINT, 100, 5 * oops + 1);
		player_over_exert(player, PY_EXERT_CON, 50, 0);
	}

	/* Redraw mana */
	player->upkeep->redraw |= (PR_MANA);

	return true;
}